

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightLeSample * __thiscall
pbrt::DiffuseAreaLight::SampleLe
          (LightLeSample *__return_storage_ptr__,DiffuseAreaLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  float fVar1;
  ShapeSample *pSVar2;
  ShapeSample *pSVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar11 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  SampledSpectrum SVar17;
  Vector3f VVar18;
  Point3f PVar19;
  optional<pbrt::ShapeSample> ss;
  Frame nFrame;
  Point2f u;
  Tuple3<pbrt::Vector3,_float> local_140;
  Tuple3<pbrt::Point3,_float> local_130;
  SampledSpectrum local_120;
  optional<pbrt::ShapeSample> local_110;
  Frame local_ac;
  RayDifferential local_88;
  undefined1 auVar16 [56];
  
  TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
  ::Dispatch<pbrt::ShapeHandle::Sample(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
            (&local_110,
             (TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
              *)&this->shape,(anon_class_8_1_54a39815)u1);
  if (local_110.set != false) {
    pSVar2 = pstd::optional<pbrt::ShapeSample>::value(&local_110);
    auVar11 = (undefined1  [56])0x0;
    (pSVar2->intr).time = time;
    pSVar2 = pstd::optional<pbrt::ShapeSample>::value(&local_110);
    (pSVar2->intr).mediumInterface = &(this->super_LightBase).mediumInterface;
    if (this->twoSided == true) {
      fVar1 = (u2->super_Tuple2<pbrt::Point2,_float>).x;
      local_88.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y =
           (u2->super_Tuple2<pbrt::Point2,_float>).y;
      if (0.5 <= fVar1) {
        auVar12 = ZEXT464(0x3f7fffff);
        auVar4 = vminss_avx(auVar12._0_16_,ZEXT416((uint)(fVar1 + -0.5 + fVar1 + -0.5)));
        auVar11 = ZEXT856(auVar4._8_8_);
        local_88.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x = auVar4._0_4_;
        VVar18 = SampleCosineHemisphere((Point2f *)&local_88);
        auVar14._4_60_ = auVar12._4_60_;
        auVar14._0_4_ = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar7._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar7._8_56_ = auVar11;
        auVar5 = auVar7._0_16_;
        auVar4._8_4_ = 0x80000000;
        auVar4._0_8_ = 0x8000000080000000;
        auVar4._12_4_ = 0x80000000;
        auVar4 = vxorps_avx512vl(auVar14._0_16_,auVar4);
      }
      else {
        auVar12 = ZEXT464(0x3f7fffff);
        auVar4 = vminss_avx(auVar12._0_16_,ZEXT416((uint)(fVar1 + fVar1)));
        auVar11 = ZEXT856(auVar4._8_8_);
        local_88.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x = auVar4._0_4_;
        VVar18 = SampleCosineHemisphere((Point2f *)&local_88);
        auVar13._4_60_ = auVar12._4_60_;
        auVar13._0_4_ = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar4 = auVar13._0_16_;
        auVar6._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar6._8_56_ = auVar11;
        auVar5 = auVar6._0_16_;
      }
      local_140._0_8_ = vmovlps_avx(auVar5);
      auVar5._8_4_ = 0x7fffffff;
      auVar5._0_8_ = 0x7fffffff7fffffff;
      auVar5._12_4_ = 0x7fffffff;
      auVar5 = vandps_avx512vl(auVar4,auVar5);
      local_140.z = auVar4._0_4_;
      fVar1 = auVar5._0_4_ * 0.31830987 * 0.5;
    }
    else {
      VVar18 = SampleCosineHemisphere(u2);
      local_140.z = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar12._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar12._8_56_ = auVar11;
      local_140._0_8_ = vmovlps_avx(auVar12._0_16_);
      fVar1 = local_140.z * 0.31830987;
    }
    auVar16 = SUB6056((undefined1  [60])0x0,4);
    auVar11 = ZEXT856(0);
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      pSVar2 = pstd::optional<pbrt::ShapeSample>::value(&local_110);
      Frame::FromZ(&local_ac,&(pSVar2->intr).n);
      VVar18 = Frame::FromLocal(&local_ac,(Vector3f *)&local_140);
      local_140.z = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar8._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar8._8_56_ = auVar11;
      local_140._0_8_ = vmovlps_avx(auVar8._0_16_);
      pSVar2 = pstd::optional<pbrt::ShapeSample>::value(&local_110);
      PVar19 = Interaction::p(&pSVar2->intr);
      local_130.z = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
      auVar9._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar9._8_56_ = auVar11;
      local_130._0_8_ = vmovlps_avx(auVar9._0_16_);
      pSVar2 = pstd::optional<pbrt::ShapeSample>::value(&local_110);
      pSVar3 = pstd::optional<pbrt::ShapeSample>::value(&local_110);
      SVar17 = L(this,(Point3f *)&local_130,&(pSVar2->intr).n,&(pSVar3->intr).uv,
                 (Vector3f *)&local_140,lambda);
      auVar15._0_8_ = SVar17.values.values._8_8_;
      auVar15._8_56_ = auVar16;
      auVar10._0_8_ = SVar17.values.values._0_8_;
      auVar10._8_56_ = auVar11;
      local_120.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,auVar15._0_16_);
      pSVar2 = pstd::optional<pbrt::ShapeSample>::value(&local_110);
      Interaction::SpawnRay(&local_88,&pSVar2->intr,(Vector3f *)&local_140);
      pSVar2 = pstd::optional<pbrt::ShapeSample>::value(&local_110);
      pSVar3 = pstd::optional<pbrt::ShapeSample>::value(&local_110);
      LightLeSample::LightLeSample
                (__return_storage_ptr__,&local_120,&local_88.super_Ray,&pSVar2->intr,pSVar3->pdf,
                 fVar1);
      goto LAB_0039fb7b;
    }
  }
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x48) = 0;
  *(undefined8 *)&(__return_storage_ptr__->intr).set = 0;
  __return_storage_ptr__->pdfPos = 0.0;
  __return_storage_ptr__->pdfDir = 0.0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x40) = 0;
  (__return_storage_ptr__->L).values.values[0] = 0.0;
  (__return_storage_ptr__->L).values.values[1] = 0.0;
  (__return_storage_ptr__->L).values.values[2] = 0.0;
  (__return_storage_ptr__->L).values.values[3] = 0.0;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z = 0;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->ray).time = 0;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (__return_storage_ptr__->intr).optionalValue.__align = (anon_struct_8_0_00000001_for___align)0x0;
LAB_0039fb7b:
  pstd::optional<pbrt::ShapeSample>::~optional(&local_110);
  return __return_storage_ptr__;
}

Assistant:

LightLeSample DiffuseAreaLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                         SampledWavelengths &lambda, Float time) const {
    // Sample a point on the area light's _Shape_
    Float pdfDir;
    pstd::optional<ShapeSample> ss = shape.Sample(u1);
    if (!ss)
        return {};
    ss->intr.time = time;
    ss->intr.mediumInterface = &mediumInterface;

    // Sample a cosine-weighted outgoing direction _w_ for area light
    Vector3f w;
    if (twoSided) {
        Point2f u = u2;
        // Choose a side to sample and then remap u[0] to [0,1] before
        // applying cosine-weighted hemisphere sampling for the chosen side.
        if (u[0] < .5) {
            u[0] = std::min(u[0] * 2, OneMinusEpsilon);
            w = SampleCosineHemisphere(u);
        } else {
            u[0] = std::min((u[0] - .5f) * 2, OneMinusEpsilon);
            w = SampleCosineHemisphere(u);
            w.z *= -1;
        }
        pdfDir = 0.5f * CosineHemispherePDF(std::abs(w.z));
    } else {
        w = SampleCosineHemisphere(u2);
        pdfDir = CosineHemispherePDF(w.z);
    }

    if (pdfDir == 0)
        return {};

    // Return _LightLeSample_ for ray leaving area light
    Frame nFrame = Frame::FromZ(ss->intr.n);
    w = nFrame.FromLocal(w);
    return LightLeSample(L(ss->intr.p(), ss->intr.n, ss->intr.uv, w, lambda),
                         ss->intr.SpawnRay(w), ss->intr, ss->pdf, pdfDir);
}